

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

GCstr * lj_lib_checkstr(lua_State *L,int narg)

{
  cTValue *o_00;
  GCstr *s;
  TValue *o;
  int narg_local;
  lua_State *L_local;
  
  o_00 = L->base + (long)narg + -1;
  if (o_00 < L->top) {
    if ((int)(o_00->field_4).it >> 0xf == -5) {
      L_local = (lua_State *)(o_00->u64 & 0x7fffffffffff);
    }
    else {
      if (0xfffffff2 < (uint)((int)(o_00->field_4).it >> 0xf)) goto LAB_00131ca9;
      L_local = (lua_State *)lj_strfmt_number(L,o_00);
      o_00->u64 = (ulong)L_local | 0xfffd800000000000;
    }
    return (GCstr *)L_local;
  }
LAB_00131ca9:
  lj_err_argt(L,narg,4);
}

Assistant:

GCstr *lj_lib_checkstr(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (LJ_LIKELY(tvisstr(o))) {
      return strV(o);
    } else if (tvisnumber(o)) {
      GCstr *s = lj_strfmt_number(L, o);
      setstrV(L, o, s);
      return s;
    }
  }
  lj_err_argt(L, narg, LUA_TSTRING);
  return NULL;  /* unreachable */
}